

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

bool __thiscall LowererMDArch::GenerateFastDivAndRem_Signed(LowererMDArch *this,Instr *instrDiv)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Opnd *src1;
  Opnd *this_00;
  Opnd *dst_00;
  IntConstOpnd *pIVar7;
  RegOpnd *dst_01;
  JITTimeFunctionBody *this_01;
  RegOpnd *pRVar8;
  RegOpnd *dst_02;
  Instr *instr;
  DivMagicNumber DVar9;
  Opnd *tmpReg2;
  Instr *imul;
  Opnd *divident64Reg;
  Opnd *quotient64reg;
  int32 multiplier;
  int local_5c;
  uint uStack_58;
  DivMagicNumber magic_number;
  int k;
  bool isNegDevisor;
  Opnd *result;
  int constDivisor;
  Opnd *dst;
  Opnd *divisor;
  Opnd *divident;
  Instr *instrDiv_local;
  LowererMDArch *this_local;
  
  if ((instrDiv->m_opcode != Div_I4) && (instrDiv->m_opcode != Rem_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb6c,
                       "(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4)"
                       ,
                       "instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  src1 = IR::Instr::GetSrc1(instrDiv);
  this_00 = IR::Instr::GetSrc2(instrDiv);
  dst_00 = IR::Instr::GetDst(instrDiv);
  pIVar7 = IR::Opnd::AsIntConstOpnd(this_00);
  result._4_4_ = IR::IntConstOpnd::AsInt32(pIVar7);
  dst_01 = IR::RegOpnd::New(TyInt32,this->m_func);
  IVar3 = IR::Opnd::GetType(this_00);
  if (IVar3 != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xb76,"(divisor->GetType() == TyInt32)","divisor->GetType() == TyInt32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = (int)result._4_4_ < 0;
  if (bVar2) {
    result._4_4_ = -result._4_4_;
  }
  if (((int)result._4_4_ < 1) || (0x7ffffffe < (int)result._4_4_)) {
    this_local._7_1_ = false;
  }
  else {
    if (result._4_4_ == 1) {
      this_01 = Func::GetJITFunctionBody(this->m_func);
      bVar4 = JITTimeFunctionBody::IsWasmFunction(this_01);
      if ((bVar4) && (bVar2)) {
        return false;
      }
      Lowerer::InsertMove(dst_00,src1,instrDiv,true);
    }
    else {
      bVar4 = Math::IsPow2(result._4_4_);
      if (bVar4) {
        uVar5 = Math::Log2(result._4_4_);
        pIVar7 = IR::IntConstOpnd::New((long)(int)(uVar5 - 1),TyInt8,this->m_func,false);
        Lowerer::InsertShift(Shr_A,false,&dst_01->super_Opnd,src1,&pIVar7->super_Opnd,instrDiv);
        pIVar7 = IR::IntConstOpnd::New((long)(int)(0x20 - uVar5),TyInt8,this->m_func,false);
        Lowerer::InsertShift
                  (ShrU_A,false,&dst_01->super_Opnd,&dst_01->super_Opnd,&pIVar7->super_Opnd,instrDiv
                  );
        Lowerer::InsertAdd(false,&dst_01->super_Opnd,&dst_01->super_Opnd,src1,instrDiv);
        pIVar7 = IR::IntConstOpnd::New((long)(int)uVar5,TyInt8,this->m_func,false);
        Lowerer::InsertShift(Shr_A,false,dst_00,&dst_01->super_Opnd,&pIVar7->super_Opnd,instrDiv);
      }
      else {
        DVar9 = Js::NumberUtilities::GenerateDivMagicNumber(result._4_4_);
        local_5c = DVar9.multiplier;
        pRVar8 = IR::RegOpnd::New(TyInt64,this->m_func);
        dst_02 = IR::RegOpnd::New(TyInt64,this->m_func);
        Lowerer::InsertMove(&dst_02->super_Opnd,src1,instrDiv,true);
        pIVar7 = IR::IntConstOpnd::New((long)local_5c,TyInt32,this->m_func,false);
        instr = IR::Instr::New(IMUL2,&pRVar8->super_Opnd,&pIVar7->super_Opnd,&dst_02->super_Opnd,
                               this->m_func);
        IR::Instr::InsertBefore(instrDiv,instr);
        LowererMD::Legalize<false>(instr,false);
        pIVar7 = IR::IntConstOpnd::New(0x20,TyInt8,this->m_func,false);
        Lowerer::InsertShift
                  (Shr_A,false,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pIVar7->super_Opnd,instrDiv)
        ;
        Lowerer::InsertMove(&dst_01->super_Opnd,&pRVar8->super_Opnd,instrDiv,true);
        if (local_5c < 0) {
          Lowerer::InsertAdd(false,&dst_01->super_Opnd,&dst_01->super_Opnd,src1,instrDiv);
        }
        uStack_58 = DVar9.shiftAmt;
        if (uStack_58 != 0) {
          pIVar7 = IR::IntConstOpnd::New((ulong)uStack_58,TyInt8,this->m_func,false);
          Lowerer::InsertShift
                    (Shr_A,false,&dst_01->super_Opnd,&dst_01->super_Opnd,&pIVar7->super_Opnd,
                     instrDiv);
        }
        pRVar8 = IR::RegOpnd::New(TyInt32,this->m_func);
        Lowerer::InsertMove(&pRVar8->super_Opnd,src1,instrDiv,true);
        pIVar7 = IR::IntConstOpnd::New(0x1f,TyInt8,this->m_func,false);
        Lowerer::InsertShift
                  (ShrU_A,false,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pIVar7->super_Opnd,instrDiv
                  );
        Lowerer::InsertAdd(false,dst_00,&dst_01->super_Opnd,&pRVar8->super_Opnd,instrDiv);
      }
    }
    if (bVar2) {
      pIVar7 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      Lowerer::InsertSub(false,dst_00,&pIVar7->super_Opnd,dst_00,instrDiv);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LowererMDArch::GenerateFastDivAndRem_Signed(IR::Instr* instrDiv)
{
    Assert(instrDiv->m_opcode == Js::OpCode::Div_I4 || instrDiv->m_opcode == Js::OpCode::Rem_I4);

    IR::Opnd* divident  = instrDiv->GetSrc1(); // nominator
    IR::Opnd* divisor   = instrDiv->GetSrc2(); // denominator
    IR::Opnd* dst       = instrDiv->GetDst();
    int constDivisor    = divisor->AsIntConstOpnd()->AsInt32();
    IR::Opnd* result = IR::RegOpnd::New(TyInt32, this->m_func);

    bool isNegDevisor   = false;

    Assert(divisor->GetType() == TyInt32); // constopnd->AsInt32() currently does silent casts between int32 and uint32

    if (constDivisor < 0)
    {
        isNegDevisor = true;
        constDivisor *= -1;
    }

    if (constDivisor <= 0 || constDivisor > INT32_MAX - 1)
    {
        return false;
    }
    if (constDivisor == 1)
    {
        // Wasm expects x/-1 not to be folded to -x.
        if (m_func->GetJITFunctionBody()->IsWasmFunction() && isNegDevisor == true)
        {
            return false;
        }
        Lowerer::InsertMove(dst, divident, instrDiv);
    }
    else if (Math::IsPow2(constDivisor)) // Power of two
    {
        // Negative dividents needs the result incremented by 1
        // Following sequence avoids branch
        // For q = n/d and d = 2^k

        //      sar q n k-1   //2^(k-1) if n < 0 else 0
        //      shr q q 32-k
        //      add q q n
        //      sar q q k

        int k = Math::Log2(constDivisor);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, divident, IR::IntConstOpnd::New(k - 1, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, result, result, IR::IntConstOpnd::New(32 - k, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        Lowerer::InsertShift(Js::OpCode::Shr_A, false, dst, result, IR::IntConstOpnd::New(k, TyInt8, this->m_func), instrDiv);
    }
    else
    {
        // Ref: Warren's Hacker's Delight, Chapter 10
        //
        // For q = n/d where d is a signed constant
        // Calculate magic_number (multiplier) and shift amounts (shiftAmt) and replace  div with mul and shift

        Js::NumberUtilities::DivMagicNumber magic_number(Js::NumberUtilities::GenerateDivMagicNumber(constDivisor));
        int32 multiplier = magic_number.multiplier;

        // Compute mulhs divident, multiplier
        IR::Opnd* quotient64reg = IR::RegOpnd::New(TyInt64, this->m_func);
        IR::Opnd* divident64Reg = IR::RegOpnd::New(TyInt64, this->m_func);

        Lowerer::InsertMove(divident64Reg, divident, instrDiv);
        IR::Instr* imul = IR::Instr::New(LowererMD::MDImulOpcode, quotient64reg, IR::IntConstOpnd::New(multiplier, TyInt32, this->m_func), divident64Reg, this->m_func);
        instrDiv->InsertBefore(imul);
        LowererMD::Legalize(imul);

        Lowerer::InsertShift(Js::OpCode::Shr_A, false, quotient64reg, quotient64reg, IR::IntConstOpnd::New(32, TyInt8, this->m_func), instrDiv);
        Lowerer::InsertMove(result, quotient64reg, instrDiv);

        // Special handling when divisor is of type 5 and 7.
        if (multiplier < 0)
        {
            Lowerer::InsertAdd(false, result, result, divident, instrDiv);
        }
        if (magic_number.shiftAmt > 0)
        {
            Lowerer::InsertShift(Js::OpCode::Shr_A, false, result, result, IR::IntConstOpnd::New(magic_number.shiftAmt, TyInt8, this->m_func), instrDiv);
        }
        IR::Opnd* tmpReg2 = IR::RegOpnd::New(TyInt32, this->m_func);
        Lowerer::InsertMove(tmpReg2, divident, instrDiv);

        // Add 1 if divisor is less than 0
        Lowerer::InsertShift(Js::OpCode::ShrU_A, false, tmpReg2, tmpReg2, IR::IntConstOpnd::New(31, TyInt8, this->m_func), instrDiv); // 1 if divident < 0, 0 otherwise
        Lowerer::InsertAdd(false, dst, result, tmpReg2, instrDiv);
    }

    // Negate results if divident is less than zero
    if (isNegDevisor)
    {
        Lowerer::InsertSub(false, dst, IR::IntConstOpnd::New(0, TyInt8, this->m_func), dst, instrDiv);
    }
    return true;
}